

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O2

LispPTR bitblt_bitmap(LispPTR *args)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  LispPTR datum;
  uint uVar7;
  int w;
  uint uVar8;
  LispPTR *pLVar9;
  LispPTR *pLVar10;
  LispPTR *pLVar11;
  uint uVar12;
  LispPTR LVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int y;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  LispPTR LVar20;
  uint uVar21;
  uint uVar22;
  LispPTR LVar23;
  int iVar24;
  DLword *baseaddr;
  long lVar25;
  int h;
  LispPTR LVar26;
  LispPTR LVar27;
  uint uVar28;
  LispPTR LVar29;
  LispPTR LVar30;
  LispPTR LVar31;
  LispPTR LVar32;
  DLword *pDVar33;
  ulong uVar34;
  uint *puVar35;
  uint local_bc;
  LispPTR local_98;
  
  if (kbd_for_makeinit == 0) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }
  pLVar9 = NativeAligned4FromLAddr(*args);
  pLVar10 = NativeAligned4FromLAddr(args[3]);
  if ((((short)pLVar10[2] == 1) && ((short)pLVar9[2] == 1)) && (args[8] != (uint)MERGE_atom)) {
    uVar18 = args[1];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      LVar29 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      LVar29 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar18);
      LVar29 = *pLVar11;
    }
    uVar18 = args[2];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      local_98 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      local_98 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar18);
      local_98 = *pLVar11;
    }
    uVar18 = args[4];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      LVar31 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      LVar31 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar18);
      LVar31 = *pLVar11;
    }
    uVar18 = args[5];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      LVar23 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      LVar23 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar18);
      LVar23 = *pLVar11;
    }
    uVar18 = args[6];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      LVar13 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      LVar13 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar18);
      LVar13 = *pLVar11;
    }
    uVar18 = args[7];
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      LVar26 = uVar18 | 0xffff0000;
    }
    else if ((uVar18 & 0xfff0000) == 0xe0000) {
      LVar26 = uVar18 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar18);
      LVar26 = *pLVar11;
    }
    uVar18 = args[9];
    LVar32 = args[0xb];
    uVar19 = args[0xc];
    if ((uVar19 & 0xfff0000) == 0xf0000) {
      LVar20 = uVar19 | 0xffff0000;
    }
    else if ((uVar19 & 0xfff0000) == 0xe0000) {
      LVar20 = uVar19 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar19 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar19);
      LVar20 = *pLVar11;
    }
    uVar19 = args[0xd];
    if ((uVar19 & 0xfff0000) == 0xf0000) {
      LVar30 = uVar19 | 0xffff0000;
    }
    else if ((uVar19 & 0xfff0000) == 0xe0000) {
      LVar30 = uVar19 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar19 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar11 = NativeAligned4FromLAddr(uVar19);
      LVar30 = *pLVar11;
    }
    uVar1 = (ushort)pLVar10[1];
    uVar19 = (uint)uVar1;
    uVar2 = *(ushort *)((long)pLVar10 + 10);
    if (LVar32 == 0) {
      uVar12 = (uint)uVar2;
      LVar27 = 0;
      LVar32 = 0;
    }
    else {
      LVar4 = car(LVar32);
      if ((LVar4 & 0xfff0000) == 0xf0000) {
        LVar4 = LVar4 | 0xffff0000;
      }
      else if ((LVar4 & 0xfff0000) == 0xe0000) {
        LVar4 = LVar4 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        pLVar11 = NativeAligned4FromLAddr(LVar4);
        LVar4 = *pLVar11;
      }
      LVar27 = 0;
      if (0 < (int)LVar4) {
        LVar27 = LVar4;
      }
      LVar5 = cdr(LVar32);
      LVar6 = car(LVar5);
      if ((LVar6 & 0xfff0000) == 0xf0000) {
        LVar6 = LVar6 | 0xffff0000;
      }
      else if ((LVar6 & 0xfff0000) == 0xe0000) {
        LVar6 = LVar6 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        pLVar11 = NativeAligned4FromLAddr(LVar6);
        LVar6 = *pLVar11;
      }
      LVar32 = 0;
      if (0 < (int)LVar6) {
        LVar32 = LVar6;
      }
      datum = cdr(LVar5);
      LVar5 = car(datum);
      if ((LVar5 & 0xfff0000) == 0xf0000) {
        LVar5 = LVar5 | 0xffff0000;
      }
      else if ((LVar5 & 0xfff0000) == 0xe0000) {
        LVar5 = LVar5 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        pLVar11 = NativeAligned4FromLAddr(LVar5);
        LVar5 = *pLVar11;
      }
      uVar12 = LVar5 + LVar4;
      if ((int)(uint)uVar2 <= (int)(LVar5 + LVar4)) {
        uVar12 = (uint)uVar2;
      }
      LVar4 = cdr(datum);
      LVar4 = car(LVar4);
      if ((LVar4 & 0xfff0000) == 0xf0000) {
        uVar7 = LVar4 | 0xffff0000;
      }
      else if ((LVar4 & 0xfff0000) == 0xe0000) {
        uVar7 = LVar4 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        pLVar11 = NativeAligned4FromLAddr(LVar4);
        uVar7 = *pLVar11;
      }
      uVar19 = (uint)uVar1;
      if ((int)(uVar7 + LVar6) < (int)(uint)uVar1) {
        uVar19 = uVar7 + LVar6;
      }
    }
    if ((int)LVar27 <= (int)LVar31) {
      LVar27 = LVar31;
    }
    uVar7 = LVar13 + LVar31;
    if ((int)uVar12 < (int)(LVar13 + LVar31)) {
      uVar7 = uVar12;
    }
    if ((int)LVar32 <= (int)LVar23) {
      LVar32 = LVar23;
    }
    uVar12 = LVar26 + LVar23;
    if ((int)uVar19 < (int)(LVar26 + LVar23)) {
      uVar12 = uVar19;
    }
    iVar24 = LVar23 - local_98;
    iVar14 = LVar31 - LVar29;
    uVar19 = LVar27 - iVar14;
    if ((int)(LVar27 - iVar14) <= (int)LVar20) {
      uVar19 = LVar20;
    }
    uVar17 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar17 = 0;
    }
    LVar29 = LVar32 - iVar24;
    if ((int)(LVar32 - iVar24) <= (int)LVar30) {
      LVar29 = LVar30;
    }
    if ((int)LVar29 < 1) {
      LVar29 = 0;
    }
    uVar19 = LVar20 + LVar13;
    if ((int)(uVar7 - iVar14) < (int)(LVar20 + LVar13)) {
      uVar19 = uVar7 - iVar14;
    }
    if ((int)(uint)*(ushort *)((long)pLVar9 + 10) <= (int)uVar19) {
      uVar19 = (uint)*(ushort *)((long)pLVar9 + 10);
    }
    uVar7 = LVar30 + LVar26;
    if ((int)(uVar12 - iVar24) < (int)(LVar30 + LVar26)) {
      uVar7 = uVar12 - iVar24;
    }
    uVar12 = (uint)(ushort)pLVar9[1];
    if ((int)(uint)(ushort)pLVar9[1] <= (int)uVar7) {
      uVar7 = uVar12;
    }
    uVar8 = (uint)uVar17;
    w = uVar19 - uVar8;
    if (w == 0 || (int)uVar19 < (int)uVar8) {
      return 0;
    }
    h = uVar7 - LVar29;
    if (h == 0 || (int)uVar7 < (int)LVar29) {
      return 0;
    }
    y = (uint)(ushort)pLVar10[1] - (iVar24 + uVar7);
    iVar24 = uVar12 - uVar7;
    uVar7 = 1;
    if (uVar18 != ERASE_atom) {
      uVar7 = (uint)(uVar18 == INVERT_atom) * 3;
    }
    uVar21 = 2;
    if (uVar18 != PAINT_atom) {
      uVar21 = uVar7;
    }
    uVar18 = uVar8 + iVar14;
    if ((((pLVar9 == pLVar10) && (iVar24 <= y)) && (y <= (int)(uVar12 - LVar29))) &&
       ((iVar24 != y || ((0 < iVar14 && ((int)uVar18 < (int)uVar19)))))) {
      uVar12 = ((uVar12 - LVar29) + -1) * (uint)*(ushort *)((long)pLVar9 + 6) + *pLVar9;
      uVar7 = (h + y + -1) * (uint)*(ushort *)((long)pLVar10 + 6) + *pLVar10;
      bVar3 = false;
    }
    else {
      uVar12 = (uint)*(ushort *)((long)pLVar9 + 6) * iVar24 + *pLVar9;
      uVar7 = (uint)*(ushort *)((long)pLVar10 + 6) * y + *pLVar10;
      bVar3 = true;
    }
    pDVar33 = Lisp_world + uVar7;
    baseaddr = Lisp_world + uVar12;
    n_new_cursorin(baseaddr,uVar8,iVar24,w,h);
    ScreenLocked = 1;
    if (bVar3) {
      if ((int)uVar18 < 0) {
        uVar34 = -(ulong)(7 - uVar18 >> 3);
      }
      else {
        uVar34 = (ulong)(uVar18 >> 3);
      }
      uVar34 = uVar34 + (long)pDVar33;
      uVar12 = (uVar18 & 7) + ((uint)uVar34 & 3) * 8;
      uVar7 = (w + uVar12) - 1 & 0x1f;
      uVar28 = -(uint)(uVar12 == 0) | -1 << (-(char)uVar12 & 0x1fU) ^ 0xffffffffU;
      local_bc = -1 << (~(byte)uVar7 & 0x1f) & uVar28;
      uVar15 = ((int)(uVar12 + w) >> 5) - 1;
      uVar17 = (long)baseaddr + (uVar17 >> 3);
      uVar19 = (uVar8 & 7) + ((uint)uVar17 & 3) * 8;
      uVar8 = w + uVar19 + 0x1f & 0x1f;
      uVar22 = uVar19 - uVar12;
      uVar16 = uVar12 - uVar19;
    }
    else {
      uVar12 = (iVar14 + uVar19) - 1;
      if ((int)(uVar19 + iVar14) < 1) {
        uVar34 = -(ulong)(8 - (uVar19 + iVar14) >> 3);
      }
      else {
        uVar34 = (ulong)(uVar12 >> 3);
      }
      uVar34 = uVar34 + (long)pDVar33;
      uVar7 = (uVar12 & 7) + ((uint)uVar34 & 3) * 8;
      iVar14 = uVar7 - w;
      uVar12 = iVar14 + 1U & 0x1f;
      uVar28 = -1 << (~(byte)uVar7 & 0x1f);
      local_bc = (-(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU))) & uVar28;
      uVar8 = (uVar7 ^ 0xffffffff) + w;
      uVar15 = uVar8 >> 5;
      if ((int)uVar8 < 1) {
        uVar15 = 0;
      }
      uVar17 = (long)baseaddr + (ulong)(uVar19 - 1 >> 3);
      uVar8 = (uVar19 - 1 & 7) + ((uint)uVar17 & 3) * 8;
      iVar24 = uVar8 - w;
      uVar16 = iVar14 - iVar24;
      uVar22 = iVar24 - iVar14;
      uVar19 = iVar24 + 1U & 0x1f;
    }
    uVar17 = uVar17 & 0xfffffffffffffffc;
    puVar35 = (uint *)(uVar34 & 0xfffffffffffffffc);
    if (0 < h) {
      uVar34 = (ulong)uVar21;
      if (bVar3) {
        if ((uVar12 < uVar19) && (0x20 < (int)(w + uVar19))) {
          lVar25 = uVar17 + 8;
        }
        else {
          lVar25 = uVar17 + 4;
        }
        if (0x20 < (int)(w + uVar12)) {
          LVar29 = (*(code *)(&DAT_0013a77c + *(int *)(&DAT_0013a77c + uVar34 * 4)))
                             (lVar25,uVar22 & 0x1f,uVar16 & 0x1f,*puVar35);
          return LVar29;
        }
      }
      else {
        if (uVar8 < uVar7) {
          if ((int)(uVar12 + 1) < (int)(w + uVar19)) {
            lVar25 = uVar17 - 8;
          }
          else {
            lVar25 = uVar17 - 4;
          }
        }
        else {
          lVar25 = uVar17 - 4;
        }
        if (0x20 < (int)(w + uVar12)) {
          LVar29 = (*(code *)(&DAT_0013a72c + *(int *)(&DAT_0013a72c + uVar34 * 4)))
                             (lVar25,uVar22 & 0x1f,uVar16 & 0x1f,*puVar35,~uVar28,uVar12,uVar15);
          return LVar29;
        }
      }
      LVar29 = (*(code *)(&DAT_0013a7cc + *(int *)(&DAT_0013a7cc + uVar34 * 4)))
                         (~local_bc & *puVar35);
      return LVar29;
    }
    if ((DisplayRegion68k <= pDVar33) && (pDVar33 <= DISP_MAX_Address)) {
      flush_display_region(uVar18,y,w,h);
    }
    ScreenLocked = 0;
  }
  else {
    if ((BITBLTBITMAP_index == 0xffffffff) &&
       (BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP",0x13,"INTERLISP",9,0),
       BITBLTBITMAP_index == 0xffffffff)) {
      error("BITBLTBITMAP install failed");
      return 0;
    }
    MachineState.csp = MachineState.csp + 0x1a;
    ccfuncall(BITBLTBITMAP_index,0xe,3);
  }
  return 0x4c;
}

Assistant:

LispPTR bitblt_bitmap(LispPTR *args) {
  BITMAP *SourceBitmap, *DestBitmap;
  int sleft, sbottom, dleft, dbottom, width, height, clipleft, clipbottom;
  LispPTR clipreg;
  int stodx, stody, right, top, destbits, sourcebits, left, bottom;
  LispPTR sourcetype, operation, texture;
  DLword *srcbase, *dstbase;
  int dlx, dty, slx, sty, srcbpl, dstbpl, op, src_comp, backwardflg = 0, displayflg = 0;

#ifdef INIT
  init_kbd_startup;
#endif

  /* Get arguments  and check the possibilities of PUNT */
  SourceBitmap = (BITMAP *)NativeAligned4FromLAddr(args[0]);
  DestBitmap = (BITMAP *)NativeAligned4FromLAddr(args[3]);
  /* It does not handle COLOR ..... maybe later */
  destbits = DestBitmap->bmbitperpixel;
  sourcebits = SourceBitmap->bmbitperpixel;
  if ((destbits != 1) || (sourcebits != 1)) {
    PUNT_TO_BITBLTBITMAP;
  }
  sourcetype = args[8];
  /* sourcetype == MERGE_atom case must be handled in Lisp function \\PUNT.BITBLT.BITMAP */
  if (sourcetype == MERGE_atom) { PUNT_TO_BITBLTBITMAP; }

  N_GETNUMBER(args[1], sleft, bad_arg);
  N_GETNUMBER(args[2], sbottom, bad_arg);
  N_GETNUMBER(args[4], dleft, bad_arg);
  N_GETNUMBER(args[5], dbottom, bad_arg);
  N_GETNUMBER(args[6], width, bad_arg);
  N_GETNUMBER(args[7], height, bad_arg);
  operation = args[9];
  texture = args[10];
  clipreg = args[11];
  N_GETNUMBER(args[12], clipleft, bad_arg);
  N_GETNUMBER(args[13], clipbottom, bad_arg);

  left = bottom = 0;
  top = DestBitmap->bmheight;
  right = DestBitmap->bmwidth;

  if (clipreg != NIL_PTR) {
    /* clip the BITBLT using the clipping region supplied */
    LispPTR clipvalue;
    int temp, cr_left, cr_bot;

    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_left, bad_arg);
    left = max(left, cr_left);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_bot, bad_arg);
    bottom = max(bottom, cr_bot);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    right = min(right, cr_left + temp);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    top = min(top, cr_bot + temp);
  }

  left = max(left, dleft);
  right = min(right, dleft + width);
  bottom = max(bottom, dbottom);
  top = min(top, dbottom + height);
  stody = dbottom - sbottom;
  stodx = dleft - sleft;

  {
    int temp;
    left = max(clipleft, max(0, left - stodx));
    bottom = max(clipbottom, max(0, bottom - stody));
    temp = SourceBitmap->bmwidth;
    right = min(temp, min(right - stodx, clipleft + width));
    temp = SourceBitmap->bmheight;
    top = min(temp, min(top - stody, clipbottom + height));
  }

  if ((right <= left) || (top <= bottom)) return (NIL);

  /*** PUT SOURCETYPE MERGE special code HERE ***/
  /**** See above, earlier in this code check sourcetype and punting. *****/
  /**** sourcebits CANNOT be unequal to destbits from earlier check */

  if (sourcebits != destbits) {
    /* DBPRINT(("BITBLT between bitmaps of different sizes, unimplemented.")); */
      return NIL;
  }
  /* if not 1-bit-per-pixel adjust limits by pixel size */
  switch (sourcebits) {
  case 1:
      break;
  case 4:
      left = left * 4;
      right = right * 4;
      stodx = stodx * 4;
      /* Put color texture merge case here */
      break;

  case 8:
      left = left * 8;
      right = right * 8;
      stodx = stodx * 8;
      /* Put color texture merge case here */
      break;

  case 24:
      left = left * 24;
      right = right * 24;
      stodx = stodx * 24;
      /* Put color texture merge case here */
      break;
  }

  height = top - bottom;
  width = right - left;
  dty = DestBitmap->bmheight - (top + stody);
  dlx = left + stodx;
  sty = SourceBitmap->bmheight - top;
  slx = left;

  /*** Stolen from bitbltsub, to avoid the call overhead: ***/
  src_comp = bbsrc_type(sourcetype, operation);
  op = bbop(sourcetype, operation);

  dstbpl = DestBitmap->bmrasterwidth << 4;

  /* Sourcetype guaranteed not to be TEXTURE by BITBLT fn */
  srcbpl = SourceBitmap->bmrasterwidth << 4;

  /* compute flags */
  if (SourceBitmap != DestBitmap)
    ;
  else if (sty > dty)
    ;
  else if (dty > (sty + height))
    ;
  else if ((sty != dty) || ((slx < dlx) && (dlx < (slx + width))))
    backwardflg = T;

  if (backwardflg) {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * (sty + height - 1)));
    dstbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * (dty + height - 1)));
    srcbpl = 0 - srcbpl;
    dstbpl = 0 - dstbpl;
  } else {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * sty));
    dstbase =
        (DLword *)NativeAligned2FromLAddr(ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * dty));
  }

  displayflg = n_new_cursorin(srcbase, slx, sty, width, height);

do_it_now:
  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dlx, dty, width, height);
  if (displayflg) HideCursor;
#endif /*  REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, slx, dlx, width, height, srcbpl, dstbpl, backwardflg, src_comp, op, 0, 0,
         0);
#else
#define gray 0
#define dx dlx
#define sx slx
#define w width
#define h height
#define curr_gray_line dx
#define num_gray 0
  new_bitblt_code;
#undef gray
#undef dx
#undef sx
#undef w
#undef h
#undef curr_gray_line
#undef num_gray
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dlx, dty, width,height));*/
      flush_display_region(dlx, dty, width, height);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* SDL */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dlx, dty, width, height);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

  return (ATOM_T);

bad_arg:
  return (NIL);
}